

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Time.hpp
# Opt level: O2

ClockSync * binlog::systemClockSync(void)

{
  int iVar1;
  nanoseconds nVar2;
  size_t sVar3;
  int iVar4;
  int iVar5;
  ClockSync *in_RDI;
  char offset_str [6];
  allocator local_f1;
  time_t now_tt;
  tm now_tm;
  char tzName [128];
  
  nVar2 = clockSinceEpoch();
  now_tt = nVar2.__r / 1000000000;
  now_tm.tm_isdst = 0;
  now_tm._36_4_ = 0;
  now_tm.tm_gmtoff = 0;
  now_tm.tm_mon = 0;
  now_tm.tm_year = 0;
  now_tm.tm_wday = 0;
  now_tm.tm_yday = 0;
  now_tm.tm_sec = 0;
  now_tm.tm_min = 0;
  now_tm.tm_hour = 0;
  now_tm.tm_mday = 0;
  now_tm.tm_zone = (char *)0x0;
  localtime_r(&now_tt,(tm *)&now_tm);
  offset_str[4] = '\0';
  offset_str[5] = '\0';
  offset_str[0] = '\0';
  offset_str[1] = '\0';
  offset_str[2] = '\0';
  offset_str[3] = '\0';
  sVar3 = strftime(offset_str,6,"%z",(tm *)&now_tm);
  iVar5 = 0;
  if (sVar3 == 5) {
    iVar1 = ((int)offset_str[2] + offset_str[1] * 10) * 0xe10;
    iVar4 = ((int)offset_str[4] + offset_str[3] * 10) * 0x3c;
    iVar5 = 0x1d7cc0 - (iVar4 + iVar1);
    if (offset_str[0] != '-') {
      iVar5 = iVar1 + iVar4 + -0x1d7cc0;
    }
  }
  tzName[0x70] = '\0';
  tzName[0x71] = '\0';
  tzName[0x72] = '\0';
  tzName[0x73] = '\0';
  tzName[0x74] = '\0';
  tzName[0x75] = '\0';
  tzName[0x76] = '\0';
  tzName[0x77] = '\0';
  tzName[0x78] = '\0';
  tzName[0x79] = '\0';
  tzName[0x7a] = '\0';
  tzName[0x7b] = '\0';
  tzName[0x7c] = '\0';
  tzName[0x7d] = '\0';
  tzName[0x7e] = '\0';
  tzName[0x7f] = '\0';
  tzName[0x60] = '\0';
  tzName[0x61] = '\0';
  tzName[0x62] = '\0';
  tzName[99] = '\0';
  tzName[100] = '\0';
  tzName[0x65] = '\0';
  tzName[0x66] = '\0';
  tzName[0x67] = '\0';
  tzName[0x68] = '\0';
  tzName[0x69] = '\0';
  tzName[0x6a] = '\0';
  tzName[0x6b] = '\0';
  tzName[0x6c] = '\0';
  tzName[0x6d] = '\0';
  tzName[0x6e] = '\0';
  tzName[0x6f] = '\0';
  tzName[0x50] = '\0';
  tzName[0x51] = '\0';
  tzName[0x52] = '\0';
  tzName[0x53] = '\0';
  tzName[0x54] = '\0';
  tzName[0x55] = '\0';
  tzName[0x56] = '\0';
  tzName[0x57] = '\0';
  tzName[0x58] = '\0';
  tzName[0x59] = '\0';
  tzName[0x5a] = '\0';
  tzName[0x5b] = '\0';
  tzName[0x5c] = '\0';
  tzName[0x5d] = '\0';
  tzName[0x5e] = '\0';
  tzName[0x5f] = '\0';
  tzName[0x40] = '\0';
  tzName[0x41] = '\0';
  tzName[0x42] = '\0';
  tzName[0x43] = '\0';
  tzName[0x44] = '\0';
  tzName[0x45] = '\0';
  tzName[0x46] = '\0';
  tzName[0x47] = '\0';
  tzName[0x48] = '\0';
  tzName[0x49] = '\0';
  tzName[0x4a] = '\0';
  tzName[0x4b] = '\0';
  tzName[0x4c] = '\0';
  tzName[0x4d] = '\0';
  tzName[0x4e] = '\0';
  tzName[0x4f] = '\0';
  tzName[0x30] = '\0';
  tzName[0x31] = '\0';
  tzName[0x32] = '\0';
  tzName[0x33] = '\0';
  tzName[0x34] = '\0';
  tzName[0x35] = '\0';
  tzName[0x36] = '\0';
  tzName[0x37] = '\0';
  tzName[0x38] = '\0';
  tzName[0x39] = '\0';
  tzName[0x3a] = '\0';
  tzName[0x3b] = '\0';
  tzName[0x3c] = '\0';
  tzName[0x3d] = '\0';
  tzName[0x3e] = '\0';
  tzName[0x3f] = '\0';
  tzName[0x20] = '\0';
  tzName[0x21] = '\0';
  tzName[0x22] = '\0';
  tzName[0x23] = '\0';
  tzName[0x24] = '\0';
  tzName[0x25] = '\0';
  tzName[0x26] = '\0';
  tzName[0x27] = '\0';
  tzName[0x28] = '\0';
  tzName[0x29] = '\0';
  tzName[0x2a] = '\0';
  tzName[0x2b] = '\0';
  tzName[0x2c] = '\0';
  tzName[0x2d] = '\0';
  tzName[0x2e] = '\0';
  tzName[0x2f] = '\0';
  tzName[0x10] = '\0';
  tzName[0x11] = '\0';
  tzName[0x12] = '\0';
  tzName[0x13] = '\0';
  tzName[0x14] = '\0';
  tzName[0x15] = '\0';
  tzName[0x16] = '\0';
  tzName[0x17] = '\0';
  tzName[0x18] = '\0';
  tzName[0x19] = '\0';
  tzName[0x1a] = '\0';
  tzName[0x1b] = '\0';
  tzName[0x1c] = '\0';
  tzName[0x1d] = '\0';
  tzName[0x1e] = '\0';
  tzName[0x1f] = '\0';
  tzName[0] = '\0';
  tzName[1] = '\0';
  tzName[2] = '\0';
  tzName[3] = '\0';
  tzName[4] = '\0';
  tzName[5] = '\0';
  tzName[6] = '\0';
  tzName[7] = '\0';
  tzName[8] = '\0';
  tzName[9] = '\0';
  tzName[10] = '\0';
  tzName[0xb] = '\0';
  tzName[0xc] = '\0';
  tzName[0xd] = '\0';
  tzName[0xe] = '\0';
  tzName[0xf] = '\0';
  sVar3 = strftime(tzName,0x80,"%Z",(tm *)&now_tm);
  if (sVar3 == 0) {
    tzName._0_8_ = tzName._0_8_ & 0xffffffffffffff00;
  }
  in_RDI->clockValue = nVar2.__r;
  in_RDI->clockFrequency = 1000000000;
  in_RDI->nsSinceEpoch = nVar2.__r;
  in_RDI->tzOffset = iVar5;
  std::__cxx11::string::string((string *)&in_RDI->tzName,tzName,&local_f1);
  return in_RDI;
}

Assistant:

inline ClockSync systemClockSync()
{
  using Clock = std::chrono::system_clock;

  const auto since_epoch = clockSinceEpoch();
  const auto now_tp = Clock::time_point(std::chrono::duration_cast<Clock::duration>(since_epoch));
  const std::time_t now_tt = Clock::to_time_t(now_tp);

  std::tm now_tm{};
  #ifdef _WIN32
    localtime_s(&now_tm, &now_tt);
  #else // assume POSIX
    localtime_r(&now_tt, &now_tm);
  #endif

  // TODO(benedek) platform: access TZ related tm fields, where available
  int offset = 0;
  char offset_str[6] = {0};
  if (strftime(offset_str, sizeof(offset_str), "%z", &now_tm) == 5)
  {
    // offset_str is +HHMM or -HHMM
    offset = (
      ((offset_str[1]-'0') * 10 + (offset_str[2]-'0')) * 3600 +
      ((offset_str[3]-'0') * 10 + (offset_str[4]-'0')) * 60
    ) * ((offset_str[0] == '-') ? -1 : 1);
  }

  char tzName[128] = {0};
  if (strftime(tzName, sizeof(tzName), "%Z", &now_tm) == 0)
  {
    tzName[0] = 0;
  }

  using Period = decltype(since_epoch)::period;
  static_assert(Period::num == 1, "Clock measures integer fractions of a second");
  const uint64_t frequency = std::uint64_t(Period::den);

  return ClockSync{
    std::uint64_t(since_epoch.count()),
    frequency,
    std::uint64_t(std::chrono::duration_cast<std::chrono::nanoseconds>(since_epoch).count()),
    offset,
    tzName
  };
}